

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaAig.c
# Opt level: O3

void Gia_ManFromAig_rec(Gia_Man_t *pNew,Aig_Man_t *p,Aig_Obj_t *pObj)

{
  uint uVar1;
  uint uVar2;
  Aig_Obj_t *pObj_00;
  int iVar3;
  
  if ((pObj->field_5).iData != 0) {
    return;
  }
  if ((*(uint *)&pObj->field_0x18 & 7) - 7 < 0xfffffffe) {
    __assert_fail("Aig_ObjIsNode(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaAig.c"
                  ,0x3b,"void Gia_ManFromAig_rec(Gia_Man_t *, Aig_Man_t *, Aig_Obj_t *)");
  }
  Gia_ManFromAig_rec(pNew,p,(Aig_Obj_t *)((ulong)pObj->pFanin0 & 0xfffffffffffffffe));
  Gia_ManFromAig_rec(pNew,p,(Aig_Obj_t *)((ulong)pObj->pFanin1 & 0xfffffffffffffffe));
  uVar1 = *(uint *)(((ulong)pObj->pFanin0 & 0xfffffffffffffffe) + 0x28);
  if (-1 < (int)uVar1) {
    uVar2 = *(uint *)(((ulong)pObj->pFanin1 & 0xfffffffffffffffe) + 0x28);
    if (-1 < (int)uVar2) {
      iVar3 = Gia_ManAppendAnd(pNew,(uint)pObj->pFanin0 & 1 ^ uVar1,(uint)pObj->pFanin1 & 1 ^ uVar2)
      ;
      (pObj->field_5).iData = iVar3;
      if (p->pEquivs == (Aig_Obj_t **)0x0) {
        return;
      }
      pObj_00 = p->pEquivs[pObj->Id];
      if (pObj_00 == (Aig_Obj_t *)0x0) {
        return;
      }
      Gia_ManFromAig_rec(pNew,p,pObj_00);
      if ((-1 < (pObj->field_5).iData) && (-1 < (pObj_00->field_5).iData)) {
        if (pNew->pNexts == (int *)0x0) {
          return;
        }
        pNew->pNexts[(uint)(pObj->field_5).iData >> 1] = (uint)(pObj_00->field_5).iData >> 1;
        return;
      }
      __assert_fail("Lit >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/abc_global.h"
                    ,0x10c,"int Abc_Lit2Var(int)");
    }
  }
  __assert_fail("Lit >= 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/abc_global.h"
                ,0x10f,"int Abc_LitNotCond(int, int)");
}

Assistant:

void Gia_ManFromAig_rec( Gia_Man_t * pNew, Aig_Man_t * p, Aig_Obj_t * pObj )
{
    Aig_Obj_t * pNext;
    if ( pObj->iData )
        return;
    assert( Aig_ObjIsNode(pObj) );
    Gia_ManFromAig_rec( pNew, p, Aig_ObjFanin0(pObj) );
    Gia_ManFromAig_rec( pNew, p, Aig_ObjFanin1(pObj) );
    pObj->iData = Gia_ManAppendAnd( pNew, Gia_ObjChild0Copy(pObj), Gia_ObjChild1Copy(pObj) );
    if ( p->pEquivs && (pNext = Aig_ObjEquiv(p, pObj)) )
    {
        int iObjNew, iNextNew;
        Gia_ManFromAig_rec( pNew, p, pNext );
        iObjNew  = Abc_Lit2Var(pObj->iData);
        iNextNew = Abc_Lit2Var(pNext->iData);
        if ( pNew->pNexts )
            pNew->pNexts[iObjNew] = iNextNew;        
    }
}